

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O3

int xmlHashUpdateInternal
              (xmlHashTablePtr hash,xmlChar *key,xmlChar *key2,xmlChar *key3,void *payload,
              xmlHashDeallocator dealloc,int update)

{
  xmlHashEntry *pxVar1;
  xmlHashEntry *pxVar2;
  xmlChar *pxVar3;
  xmlChar *pxVar4;
  xmlChar *pxVar5;
  undefined4 uVar6;
  uint hashValue;
  int iVar7;
  uint uVar8;
  xmlHashEntry *__src;
  xmlChar *__dest;
  xmlChar *__dest_00;
  xmlChar *__dest_01;
  xmlHashEntry *pxVar9;
  uint uVar10;
  uint uVar11;
  int found;
  size_t lengths [3];
  int local_54;
  uint *local_50;
  size_t local_48;
  long lStack_40;
  long local_38;
  
  local_48 = 0;
  lStack_40 = 0;
  local_38 = 0;
  local_54 = 0;
  if (key == (xmlChar *)0x0 || hash == (xmlHashTablePtr)0x0) {
    return -1;
  }
  local_50 = (uint *)dealloc;
  hashValue = xmlHashValue(hash->randomSeed,key,key2,key3,&local_48);
  uVar8 = hash->size;
  if (uVar8 == 0) {
    local_50 = &hash->nbElems;
    uVar8 = 8;
    if (hash->nbElems == 0xffffffff) {
      __src = (xmlHashEntry *)0x0;
      goto LAB_001312a0;
    }
  }
  else {
    __src = xmlHashFindEntry(hash,key,key2,key3,hashValue,&local_54);
    if (local_54 != 0) {
      if (update != 0) {
        if ((xmlHashDeallocator)local_50 != (xmlHashDeallocator)0x0) {
          (*(code *)local_50)(__src->payload,__src->key);
        }
        __src->payload = payload;
        return 0;
      }
      return 0;
    }
    local_50 = &hash->nbElems;
    if (hash->nbElems + 1 <= (uVar8 & 0xfffffff8) - (uVar8 >> 3)) goto LAB_001312a0;
    if ((int)uVar8 < 0) {
      return -1;
    }
    uVar8 = uVar8 * 2;
  }
  local_50 = &hash->nbElems;
  iVar7 = xmlHashGrow(hash,uVar8);
  if (iVar7 != 0) {
    return -1;
  }
  uVar8 = hash->size - 1;
  __src = hash->table + (uVar8 & hashValue);
  if (__src->hashValue != 0) {
    uVar10 = 0;
    do {
      uVar11 = (uVar8 & hashValue) + 1 + uVar10;
      __src = __src + 1;
      if ((uVar11 & uVar8) == 0) {
        __src = hash->table;
      }
    } while ((__src->hashValue != 0) &&
            (uVar10 = uVar10 + 1, uVar10 <= (uVar11 - __src->hashValue & uVar8)));
  }
LAB_001312a0:
  if (hash->dict == (xmlDictPtr)0x0) {
    __dest = (xmlChar *)(*xmlMalloc)(local_48 + 1);
    if (__dest == (xmlChar *)0x0) {
      return -1;
    }
    memcpy(__dest,key,local_48 + 1);
    if (key2 == (xmlChar *)0x0) {
      __dest_00 = (xmlChar *)0x0;
    }
    else {
      __dest_00 = (xmlChar *)(*xmlMalloc)(lStack_40 + 1);
      if (__dest_00 == (xmlChar *)0x0) {
        (*xmlFree)(__dest);
        return -1;
      }
      memcpy(__dest_00,key2,lStack_40 + 1);
    }
    if (key3 == (xmlChar *)0x0) {
      __dest_01 = (xmlChar *)0x0;
    }
    else {
      __dest_01 = (xmlChar *)(*xmlMalloc)(local_38 + 1);
      if (__dest_01 == (xmlChar *)0x0) {
        (*xmlFree)(__dest);
        (*xmlFree)(__dest_00);
        return -1;
      }
      memcpy(__dest_01,key3,local_38 + 1);
    }
  }
  else {
    iVar7 = xmlDictOwns(hash->dict,key);
    __dest = key;
    if ((iVar7 == 0) && (__dest = xmlDictLookup(hash->dict,key,-1), __dest == (xmlChar *)0x0)) {
      return -1;
    }
    if (key2 == (xmlChar *)0x0) {
      __dest_00 = (xmlChar *)0x0;
    }
    else {
      iVar7 = xmlDictOwns(hash->dict,key2);
      __dest_00 = key2;
      if ((iVar7 == 0) &&
         (__dest_00 = xmlDictLookup(hash->dict,key2,-1), __dest_00 == (xmlChar *)0x0)) {
        return -1;
      }
    }
    if (key3 == (xmlChar *)0x0) {
      __dest_01 = (xmlChar *)0x0;
    }
    else {
      iVar7 = xmlDictOwns(hash->dict,key3);
      __dest_01 = key3;
      if ((iVar7 == 0) &&
         (__dest_01 = xmlDictLookup(hash->dict,key3,-1), __dest_01 == (xmlChar *)0x0)) {
        return -1;
      }
    }
  }
  if (__src->hashValue != 0) {
    pxVar2 = hash->table;
    pxVar1 = pxVar2 + hash->size;
    pxVar9 = __src;
    do {
      pxVar9 = pxVar9 + 1;
      if (pxVar1 <= pxVar9) {
        pxVar9 = pxVar2;
      }
    } while (pxVar9->hashValue != 0);
    if (pxVar9 < __src) {
      memmove(pxVar2 + 1,pxVar2,(long)pxVar9 - (long)pxVar2);
      pxVar9 = pxVar1 + -1;
      pxVar2 = hash->table;
      uVar6 = *(undefined4 *)&pxVar1[-1].field_0x4;
      pxVar3 = pxVar1[-1].key;
      pxVar4 = pxVar1[-1].key2;
      pxVar5 = pxVar1[-1].key3;
      pxVar2->hashValue = pxVar1[-1].hashValue;
      *(undefined4 *)&pxVar2->field_0x4 = uVar6;
      pxVar2->key = pxVar3;
      pxVar2->key2 = pxVar4;
      pxVar2->key3 = pxVar5;
      pxVar2->payload = pxVar1[-1].payload;
    }
    memmove(__src + 1,__src,(long)pxVar9 - (long)__src);
  }
  __src->key = __dest;
  __src->key2 = __dest_00;
  __src->key3 = __dest_01;
  __src->payload = payload;
  __src->hashValue = hashValue | 0x80000000;
  *local_50 = *local_50 + 1;
  return 1;
}

Assistant:

ATTRIBUTE_NO_SANITIZE_INTEGER
static int
xmlHashUpdateInternal(xmlHashTablePtr hash, const xmlChar *key,
                      const xmlChar *key2, const xmlChar *key3,
                      void *payload, xmlHashDeallocator dealloc, int update) {
    xmlChar *copy, *copy2, *copy3;
    xmlHashEntry *entry = NULL;
    size_t lengths[3] = {0, 0, 0};
    unsigned hashValue;
    int found = 0;

    if ((hash == NULL) || (key == NULL))
        return(-1);

    /*
     * Check for an existing entry
     */
    hashValue = xmlHashValue(hash->randomSeed, key, key2, key3, lengths);
    if (hash->size > 0)
        entry = xmlHashFindEntry(hash, key, key2, key3, hashValue, &found);
    if (found) {
        if (update) {
            if (dealloc)
                dealloc(entry->payload, entry->key);
            entry->payload = payload;
        }

        return(0);
    }

    /*
     * Grow the hash table if needed
     */
    if (hash->nbElems + 1 > hash->size / MAX_FILL_DENOM * MAX_FILL_NUM) {
        unsigned newSize, mask, displ, pos;

        if (hash->size == 0) {
            newSize = MIN_HASH_SIZE;
        } else {
            /* This guarantees that nbElems < INT_MAX */
            if (hash->size >= MAX_HASH_SIZE)
                return(-1);
            newSize = hash->size * 2;
        }
        if (xmlHashGrow(hash, newSize) != 0)
            return(-1);

        /*
         * Find new entry
         */
        mask = hash->size - 1;
        displ = 0;
        pos = hashValue & mask;
        entry = &hash->table[pos];

        if (entry->hashValue != 0) {
            do {
                displ++;
                pos++;
                entry++;
                if ((pos & mask) == 0)
                    entry = hash->table;
            } while ((entry->hashValue != 0) &&
                     ((pos - entry->hashValue) & mask) >= displ);
        }
    }

    /*
     * Copy keys
     */
    if (hash->dict != NULL) {
        if (xmlDictOwns(hash->dict, key)) {
            copy = (xmlChar *) key;
        } else {
            copy = (xmlChar *) xmlDictLookup(hash->dict, key, -1);
            if (copy == NULL)
                return(-1);
        }

        if ((key2 == NULL) || (xmlDictOwns(hash->dict, key2))) {
            copy2 = (xmlChar *) key2;
        } else {
            copy2 = (xmlChar *) xmlDictLookup(hash->dict, key2, -1);
            if (copy2 == NULL)
                return(-1);
        }
        if ((key3 == NULL) || (xmlDictOwns(hash->dict, key3))) {
            copy3 = (xmlChar *) key3;
        } else {
            copy3 = (xmlChar *) xmlDictLookup(hash->dict, key3, -1);
            if (copy3 == NULL)
                return(-1);
        }
    } else {
        copy = xmlMalloc(lengths[0] + 1);
        if (copy == NULL)
            return(-1);
        memcpy(copy, key, lengths[0] + 1);

        if (key2 != NULL) {
            copy2 = xmlMalloc(lengths[1] + 1);
            if (copy2 == NULL) {
                xmlFree(copy);
                return(-1);
            }
            memcpy(copy2, key2, lengths[1] + 1);
        } else {
            copy2 = NULL;
        }

        if (key3 != NULL) {
            copy3 = xmlMalloc(lengths[2] + 1);
            if (copy3 == NULL) {
                xmlFree(copy);
                xmlFree(copy2);
                return(-1);
            }
            memcpy(copy3, key3, lengths[2] + 1);
        } else {
            copy3 = NULL;
        }
    }

    /*
     * Shift the remainder of the probe sequence to the right
     */
    if (entry->hashValue != 0) {
        const xmlHashEntry *end = &hash->table[hash->size];
        const xmlHashEntry *cur = entry;

        do {
            cur++;
            if (cur >= end)
                cur = hash->table;
        } while (cur->hashValue != 0);

        if (cur < entry) {
            /*
             * If we traversed the end of the buffer, handle the part
             * at the start of the buffer.
             */
            memmove(&hash->table[1], hash->table,
                    (char *) cur - (char *) hash->table);
            cur = end - 1;
            hash->table[0] = *cur;
        }

        memmove(&entry[1], entry, (char *) cur - (char *) entry);
    }

    /*
     * Populate entry
     */
    entry->key = copy;
    entry->key2 = copy2;
    entry->key3 = copy3;
    entry->payload = payload;
    /* OR with MAX_HASH_SIZE to make sure that the value is non-zero */
    entry->hashValue = hashValue | MAX_HASH_SIZE;

    hash->nbElems++;

    return(1);
}